

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

TestConfig_conflict *
vkt::memory::anon_unknown_0::subMappedConfig
          (TestConfig_conflict *__return_storage_ptr__,VkDeviceSize allocationSize,
          MemoryRange *mapping,Op op,deUint32 seed)

{
  ulong uVar1;
  MemoryRange local_270;
  MemoryRange local_260;
  MemoryRange local_250;
  MemoryRange local_240;
  MemoryRange local_230;
  MemoryRange local_220;
  MemoryRange local_210;
  MemoryRange local_200;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_1e9;
  MemoryRange local_1e8;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_1d8;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_1b9;
  MemoryRange local_1b8;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_1a8;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_189;
  MemoryRange local_188;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_178;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_159;
  MemoryRange local_158;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_148;
  MemoryRange local_130;
  MemoryRange local_120;
  MemoryRange local_110;
  MemoryRange local_100;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_e9;
  MemoryRange local_e8;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_d8;
  allocator<vkt::memory::(anonymous_namespace)::MemoryRange> local_bd [13];
  MemoryRange local_b0;
  vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  local_a0;
  undefined4 local_84;
  undefined1 local_80 [8];
  TestConfig_conflict config;
  deUint32 seed_local;
  Op op_local;
  MemoryRange *mapping_local;
  VkDeviceSize allocationSize_local;
  
  config._80_4_ = seed;
  config._84_4_ = op;
  TestConfig::TestConfig((TestConfig *)local_80);
  config.allocationSize._0_1_ = config.remap;
  config.allocationSize._1_3_ = config._81_3_;
  config._8_8_ = mapping->offset;
  config.mapping.offset = mapping->size;
  config.invalidateMappings.
  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_80 = (undefined1  [8])allocationSize;
  switch(config._84_4_) {
  case (BADTYPE)0x0:
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x1:
    MemoryRange::MemoryRange(&local_b0,mapping->offset,mapping->size);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(local_bd);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_a0,1,&local_b0,local_bd);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_a0);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_a0);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(local_bd);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x2:
    MemoryRange::MemoryRange(&local_e8,mapping->offset + (mapping->size >> 2),mapping->size >> 1);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(&local_e9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_d8,1,&local_e8,&local_e9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_d8);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_d8);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(&local_e9);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x3:
    uVar1 = mapping->size >> 1;
    MemoryRange::MemoryRange(&local_100,mapping->offset + uVar1,mapping->size - uVar1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_100);
    MemoryRange::MemoryRange(&local_110,mapping->offset,mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_110);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x4:
    uVar1 = mapping->size;
    MemoryRange::MemoryRange(&local_120,mapping->offset + uVar1 / 3,uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_120);
    MemoryRange::MemoryRange(&local_130,mapping->offset,(mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_130);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x5:
    MemoryRange::MemoryRange(&local_158,mapping->offset,mapping->size);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(&local_159);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_148,1,&local_158,&local_159);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_148);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_148);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(&local_159);
    MemoryRange::MemoryRange(&local_188,mapping->offset,mapping->size);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(&local_189);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_178,1,&local_188,&local_189);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_178);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_178);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(&local_189);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x6:
    MemoryRange::MemoryRange(&local_1b8,mapping->offset + (mapping->size >> 2),mapping->size >> 1);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(&local_1b9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_1a8,1,&local_1b8,&local_1b9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_1a8);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_1a8);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(&local_1b9);
    MemoryRange::MemoryRange(&local_1e8,mapping->offset + (mapping->size >> 2),mapping->size >> 1);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::allocator(&local_1e9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::vector(&local_1d8,1,&local_1e8,&local_1e9);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::operator=((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1d8);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::~vector(&local_1d8);
    std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>::~allocator(&local_1e9);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x7:
    uVar1 = mapping->size >> 1;
    MemoryRange::MemoryRange(&local_200,mapping->offset + uVar1,mapping->size - uVar1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_200);
    MemoryRange::MemoryRange(&local_210,mapping->offset,mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_210);
    uVar1 = mapping->size >> 1;
    MemoryRange::MemoryRange(&local_220,mapping->offset + uVar1,mapping->size - uVar1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_220);
    MemoryRange::MemoryRange(&local_230,mapping->offset,mapping->size >> 1);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_230);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x8:
    uVar1 = mapping->size;
    MemoryRange::MemoryRange(&local_240,mapping->offset + uVar1 / 3,uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_240);
    MemoryRange::MemoryRange(&local_250,mapping->offset,(mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.mapping.size,&local_250);
    uVar1 = mapping->size;
    MemoryRange::MemoryRange(&local_260,mapping->offset + uVar1 / 3,uVar1 - (uVar1 >> 1));
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_260);
    MemoryRange::MemoryRange(&local_270,mapping->offset,(mapping->size * 2) / 3);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                 *)&config.flushMappings.
                    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_270);
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  case (BADTYPE)0x9:
    config.invalidateMappings.
    super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryRange,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryRange>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__,(TestConfig_conflict *)local_80);
    break;
  default:
    TestConfig::TestConfig((TestConfig *)__return_storage_ptr__);
  }
  local_84 = 1;
  TestConfig::~TestConfig((TestConfig *)local_80);
  return __return_storage_ptr__;
}

Assistant:

TestConfig subMappedConfig (VkDeviceSize				allocationSize,
							const MemoryRange&			mapping,
							Op							op,
							deUint32					seed)
{
	TestConfig config;

	config.allocationSize	= allocationSize;
	config.seed				= seed;
	config.mapping			= mapping;
	config.remap			= false;

	switch (op)
	{
		case OP_NONE:
			return config;

		case OP_REMAP:
			config.remap = true;
			return config;

		case OP_FLUSH:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_FLUSH:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_FLUSH_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_FLUSH_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		case OP_INVALIDATE:
			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset, mapping.size));
			return config;

		case OP_SUB_INVALIDATE:
			DE_ASSERT(mapping.size / 4 > 0);

			config.flushMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			config.invalidateMappings = vector<MemoryRange>(1, MemoryRange(mapping.offset + mapping.size / 4, mapping.size / 2));
			return config;

		case OP_SUB_INVALIDATE_SEPARATE:
			DE_ASSERT(mapping.size / 2 > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  2, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, mapping.size / 2));

			return config;

		case OP_SUB_INVALIDATE_OVERLAPPING:
			DE_ASSERT((mapping.size / 3) > 0);

			config.flushMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.flushMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			config.invalidateMappings.push_back(MemoryRange(mapping.offset + mapping.size /  3, mapping.size - (mapping.size / 2)));
			config.invalidateMappings.push_back(MemoryRange(mapping.offset, (2 * mapping.size) / 3));

			return config;

		default:
			DE_FATAL("Unknown Op");
			return TestConfig();
	}
}